

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second)

{
  Lexeme *allocator;
  TypeBase *type;
  ExprBase *source_00;
  ExprSequence *this;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase*> local_70 [32];
  undefined1 local_50 [8];
  SmallArray<ExprBase_*,_2U> expressions;
  ExprBase *second_local;
  ExprBase *first_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  expressions.allocator = (Allocator *)second;
  second_local = first;
  first_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  SmallArray<ExprBase_*,_2U>::SmallArray((SmallArray<ExprBase_*,_2U> *)local_50,ctx->allocator);
  SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_50,&second_local);
  SmallArray<ExprBase_*,_2U>::push_back
            ((SmallArray<ExprBase_*,_2U> *)local_50,(ExprBase **)&expressions.allocator);
  this = ExpressionContext::get<ExprSequence>((ExpressionContext *)source_local);
  source_00 = first_local;
  allocator = source_local[0x229].begin;
  type = (TypeBase *)expressions.allocator[3]._vptr_Allocator;
  ArrayView<ExprBase*>::ArrayView<2u>(local_70,(SmallArray<ExprBase_*,_2U> *)local_50);
  arr._12_4_ = 0;
  arr._0_12_ = local_70._0_12_;
  ExprSequence::ExprSequence(this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
  SmallArray<ExprBase_*,_2U>::~SmallArray((SmallArray<ExprBase_*,_2U> *)local_50);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second)
{
	SmallArray<ExprBase*, 2> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, second->type, expressions);
}